

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

void Lf_ManPrintStats(Lf_Man_t *p,char *pTitle)

{
  abctime aVar1;
  abctime time;
  char *pStr;
  
  if (p->pPars->fVerbose != 0) {
    printf("%s :  ");
    printf("Level =%6lu   ",p->pPars->Delay);
    printf("Area =%9lu   ",p->pPars->Area);
    printf("Edge =%9lu   ",p->pPars->Edge);
    pStr = (char *)((long)p->nInverters + p->pPars->Area);
    printf("LUT =%9lu  ");
    if ((p->vSwitches).nSize != 0) {
      printf("Swt =%8.1f  ",p->Switches);
    }
    if (p->pPars->fUseMux7 != 0) {
      pStr = (char *)p->pPars->Mux7;
      printf("Mux7 =%7lu  ");
    }
    aVar1 = Abc_Clock();
    Abc_PrintTime((int)aVar1 - (int)p->clkStart,pStr,time);
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

void Lf_ManPrintStats( Lf_Man_t * p, char * pTitle )
{
    if ( !p->pPars->fVerbose )
        return;
    printf( "%s :  ", pTitle );
    printf( "Level =%6lu   ",   p->pPars->Delay );
    printf( "Area =%9lu   ",    p->pPars->Area );
    printf( "Edge =%9lu   ",    p->pPars->Edge );
    printf( "LUT =%9lu  ",      p->pPars->Area+p->nInverters );
    if ( Vec_FltSize(&p->vSwitches) )
        printf( "Swt =%8.1f  ", p->Switches );
    if ( p->pPars->fUseMux7 )
        printf( "Mux7 =%7lu  ", p->pPars->Mux7 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
    fflush( stdout );
}